

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<char16_t> * __thiscall kj::ArrayBuilder<char16_t>::finish(ArrayBuilder<char16_t> *this)

{
  char16_t *pcVar1;
  RemoveConst<char16_t> *pRVar2;
  ArrayDisposer *pAVar3;
  Array<char16_t> *result;
  Array<char16_t> *in_RDI;
  
  pcVar1 = this->ptr;
  pRVar2 = this->pos;
  pAVar3 = this->disposer;
  in_RDI->ptr = pcVar1;
  in_RDI->size_ = (long)pRVar2 - (long)pcVar1 >> 1;
  in_RDI->disposer = pAVar3;
  this->ptr = (char16_t *)0x0;
  this->pos = (RemoveConst<char16_t> *)0x0;
  this->endPtr = (char16_t *)0x0;
  return in_RDI;
}

Assistant:

Array<T> finish() {
    // We could safely remove this check if we assume that the disposer implementation doesn't
    // need to know the original capacity, as is the case with HeapArrayDisposer since it uses
    // operator new() or if we created a custom disposer for ArrayBuilder which stores the capacity
    // in a prefix.  But that would make it hard to write cleverer heap allocators, and anyway this
    // check might catch bugs.  Probably people should use Vector if they want to build arrays
    // without knowing the final size in advance.
    KJ_IREQUIRE(pos == endPtr, "ArrayBuilder::finish() called prematurely.");
    Array<T> result(reinterpret_cast<T*>(ptr), pos - ptr, *disposer);
    ptr = nullptr;
    pos = nullptr;
    endPtr = nullptr;
    return result;
  }